

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::AssembleNew(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              *this,TPZMatrix<std::complex<double>_> *stiffness,
             TPZFMatrix<std::complex<double>_> *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *this_00;
  TPZGuiInterface *this_01;
  TPZCompEl *pTVar1;
  bool bVar2;
  int iVar3;
  int64_t size;
  TPZCompEl **ppTVar4;
  ostream *poVar5;
  long lVar6;
  long nelem;
  TPZFMatrix<std::complex<double>_> *rhs_00;
  long lVar7;
  long lVar8;
  int iStack_104d4;
  TPZVec<int> elorder;
  TPZManVector<long,_10> sourceindex;
  TPZManVector<long,_10> destinationindex;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZElementMatrixT<std::complex<double>_> ef;
  
  lVar7 = ((*(TPZCompMesh **)&this->field_0x8)->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&ek,*(TPZCompMesh **)&this->field_0x8,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&ef,*(TPZCompMesh **)&this->field_0x8,EF);
  TPZManVector<long,_10>::TPZManVector(&destinationindex,0);
  TPZManVector<long,_10>::TPZManVector(&sourceindex,0);
  this_00 = *(TPZCompMesh **)&this->field_0x8;
  size = TPZCompMesh::NEquations(this_00);
  iStack_104d4 = 0;
  TPZVec<int>::TPZVec(&elorder,size,&iStack_104d4);
  OrderElement(this);
  lVar8 = 0;
  if (lVar7 < 1) {
    lVar7 = lVar8;
  }
  for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
    if ((guiInterface->fRef != (TPZReference *)0x0) &&
       (this_01 = guiInterface->fRef->fPointer, this_01 != (TPZGuiInterface *)0x0)) {
      bVar2 = TPZGuiInterface::AmIKilled(this_01);
      if (bVar2) break;
    }
    nelem = (long)(this->fElementOrder).fStore[lVar6];
    if (-1 < nelem) {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this_00->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar1 = *ppTVar4;
      if (pTVar1 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,&ek,&ef);
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  ((TPZEquationFilter *)&this->field_0x48,
                   &ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        if (this->f_quiet == 0) {
          if (lVar8 % 0x14 == 0) {
            poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::ostream::_M_insert<long>((long)poVar5);
          }
          std::operator<<((ostream *)&std::cout,'*');
          std::ostream::flush();
        }
        iVar3 = (**(code **)(*(long *)pTVar1 + 0x1f0))(pTVar1);
        if (iVar3 == 0) {
          (*(stiffness->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                    (stiffness,&ek.fMat,&ek.super_TPZElementMatrix.fSourceIndex,
                     &ek.super_TPZElementMatrix.fDestinationIndex);
          rhs_00 = &ef.fMat.super_TPZFMatrix<std::complex<double>_>;
        }
        else {
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ek);
          TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ef);
          (*(stiffness->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                    (stiffness,&ek.fConstrMat,&ek.super_TPZElementMatrix.fSourceIndex,
                     &ek.super_TPZElementMatrix.fDestinationIndex);
          rhs_00 = &ef.fConstrMat.super_TPZFMatrix<std::complex<double>_>;
        }
        TPZFMatrix<std::complex<double>_>::AddFel
                  (rhs,rhs_00,&ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        lVar8 = lVar8 + 1;
      }
    }
  }
  if (this->f_quiet == 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  TPZVec<int>::~TPZVec(&elorder);
  TPZManVector<long,_10>::~TPZManVector(&sourceindex);
  TPZManVector<long,_10>::~TPZManVector(&destinationindex);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ek);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleNew(TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
	
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	TPZManVector<int64_t> destinationindex(0);
	TPZManVector<int64_t> sourceindex(0);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	
	for(iel=0; iel < nelem; iel++) {
		
		if(guiInterface) if(guiInterface->AmIKilled()){
			break;
		}
		
		if(fElementOrder[iel] < 0) continue;
		TPZCompEl *el = elementvec[fElementOrder[iel]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
		//ek.fMat->Print(out);
		//ef.fMat->Print();
		if(!f_quiet)
		{
			if(!(numel%20)) cout << endl << numel;
			//    if(!(numel%20)) cout << endl;
			cout << '*';
			cout.flush();
		}
		numel++;
		
		if(!el->HasDependency()) {
			stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);
		}
		else {
			//ek.Print(*this->fMesh,cout);
			ek.ApplyConstraints();
			ef.ApplyConstraints();
			stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			/*
			 if(ek.fConstrMat->Decompose_LU() != -1) {
			 el->ApplyConstraints(ek,ef);
			 ek.Print(*this,check);
			 check.flush();
			 }
			 */
		}
		
	}//fim for iel
	if(!f_quiet)
	{
		cout << endl;
	}
}